

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
::emplace_value<std::pair<int,int>const&>
          (btree_node<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
           *this,size_type i,allocator_type *alloc,pair<int,_int> *args)

{
  pair<int,_int> *ppVar1;
  allocator_type *paVar2;
  byte bVar3;
  byte bVar4;
  field_type fVar5;
  bool bVar6;
  slot_type *src;
  slot_type *dest;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  *c;
  uint local_3c;
  allocator_type *paStack_38;
  int j_1;
  size_type j;
  pair<int,_int> *local_28;
  pair<int,_int> *args_local;
  allocator_type *alloc_local;
  size_type i_local;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  *this_local;
  
  local_28 = args;
  args_local = (pair<int,_int> *)alloc;
  alloc_local = (allocator_type *)i;
  i_local = (size_type)this;
  bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
          ::count((btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                   *)this);
  paVar2 = alloc_local;
  if (i <= bVar3) {
    bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
            ::count((btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                     *)this);
    if (paVar2 < (allocator_type *)(ulong)bVar3) {
      bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
              ::count((btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                       *)this);
      ppVar1 = args_local;
      bVar4 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
              ::count((btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                       *)this);
      j = (size_type)
          btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
          ::slot((btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                  *)this,(long)(int)(bVar4 - 1));
      value_init<std::pair<int,int>*>
                (this,(ulong)bVar3,(allocator_type *)ppVar1,(pair<int,_int> **)&j);
      bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
              ::count((btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                       *)this);
      for (paStack_38 = (allocator_type *)(long)(int)(bVar3 - 1); ppVar1 = args_local,
          alloc_local < paStack_38; paStack_38 = paStack_38 + -1) {
        src = btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
              ::slot((btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                      *)this,(size_type)(paStack_38 + -1));
        dest = btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
               ::slot((btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                       *)this,(size_type)paStack_38);
        common_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false,_phmap::priv::set_slot_policy<std::pair<int,_int>_>_>
        ::move((allocator<std::pair<int,_int>_> *)ppVar1,src,dest);
      }
      btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
      ::value_destroy((btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                       *)this,(size_type)alloc_local,(allocator_type *)args_local);
    }
    value_init<std::pair<int,int>const&>
              (this,(size_type)alloc_local,(allocator_type *)args_local,local_28);
    fVar5 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
            ::count((btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                     *)this);
    btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
    ::set_count((btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                 *)this,fVar5 + '\x01');
    bVar6 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
            ::leaf((btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                    *)this);
    if (!bVar6) {
      bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
              ::count((btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                       *)this);
      if (alloc_local + 1 < (allocator_type *)(ulong)bVar3) {
        bVar3 = btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                ::count((btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                         *)this);
        for (local_3c = (uint)bVar3; (int)alloc_local + 1 < (int)local_3c; local_3c = local_3c - 1)
        {
          c = btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
              ::child((btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                       *)this,(long)(int)(local_3c - 1));
          btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
          ::set_child((btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                       *)this,(long)(int)local_3c,c);
        }
        btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
        ::clear_child((btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                       *)this,(size_type)(alloc_local + 1));
      }
    }
    return;
  }
  __assert_fail("i <= count()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0x852,
                "void phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>, Args = <const std::pair<int, int> &>]"
               );
}

Assistant:

inline void btree_node<P>::emplace_value(const size_type i,
                                             allocator_type *alloc,
                                             Args &&... args) {
        assert(i <= count());
        // Shift old values to create space for new value and then construct it in
        // place.
        if (i < count()) {
            value_init(count(), alloc, slot(count() - 1));
            for (size_type j = count() - 1; j > i; --j)
                params_type::move(alloc, slot(j - 1), slot(j));
            value_destroy(i, alloc);
        }
        value_init(i, alloc, std::forward<Args>(args)...);
        set_count((field_type)(count() + 1));

        if (!leaf() && count() > i + 1) {
            for (int j = count(); j > (int)(i + 1); --j) {
                set_child(j, child(j - 1));
            }
            clear_child(i + 1);
        }
    }